

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Bitmask sqlite3WhereExprUsageNN(WhereMaskSet *pMaskSet,Expr *p)

{
  uint uVar1;
  ExprList *pEVar2;
  Bitmask BVar3;
  ulong uVar4;
  int iVar5;
  ExprList_item *pEVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  
  uVar7 = 0;
  do {
    uVar1 = p->flags;
    if (p->op == 0x9e) {
      if ((uVar1 & 8) == 0) {
        if ((long)pMaskSet->n < 1) {
          uVar9 = 0;
          goto LAB_0017eee8;
        }
        lVar10 = 0;
        goto LAB_0017ee9c;
      }
      uVar8 = 0;
      uVar9 = 0;
      if ((uVar1 & 0x804000) != 0) goto LAB_0017eee8;
    }
    else {
      uVar9 = 0;
      if ((uVar1 & 0x804000) != 0) goto LAB_0017eee8;
      if ((p->op == 0xa7) && (0 < (long)pMaskSet->n)) {
        lVar10 = 0;
        do {
          if (pMaskSet->ix[lVar10] == p->iTable) {
            uVar8 = 1L << ((byte)lVar10 & 0x3f);
            goto LAB_0017edf6;
          }
          lVar10 = lVar10 + 1;
        } while (pMaskSet->n != lVar10);
      }
      uVar8 = 0;
    }
LAB_0017edf6:
    uVar9 = uVar8;
    if (p->pLeft != (Expr *)0x0) {
      BVar3 = sqlite3WhereExprUsageNN(pMaskSet,p->pLeft);
      uVar9 = uVar8 | BVar3;
    }
    if (p->pRight == (Expr *)0x0) break;
    uVar7 = uVar7 | uVar9;
    p = p->pRight;
  } while( true );
  if ((p->flags >> 0xb & 1) == 0) {
    pEVar2 = (p->x).pList;
    if (pEVar2 != (ExprList *)0x0) {
      iVar5 = pEVar2->nExpr;
      if (iVar5 < 1) {
        uVar8 = 0;
      }
      else {
        pEVar6 = pEVar2->a;
        lVar10 = 0;
        uVar8 = 0;
        do {
          if (pEVar6->pExpr == (Expr *)0x0) {
            uVar4 = 0;
          }
          else {
            uVar4 = sqlite3WhereExprUsageNN(pMaskSet,pEVar6->pExpr);
            iVar5 = pEVar2->nExpr;
          }
          uVar8 = uVar8 | uVar4;
          lVar10 = lVar10 + 1;
          pEVar6 = pEVar6 + 1;
        } while (lVar10 < iVar5);
      }
      uVar9 = uVar8 | uVar9;
    }
  }
  else {
    if ((p->flags & 0x20) != 0) {
      pMaskSet->bVarSelect = 1;
    }
    BVar3 = exprSelectUsage(pMaskSet,(p->x).pSelect);
    uVar9 = BVar3 | uVar9;
  }
  goto LAB_0017eee8;
  while (lVar10 = lVar10 + 1, uVar9 = 0, pMaskSet->n != lVar10) {
LAB_0017ee9c:
    if (pMaskSet->ix[lVar10] == p->iTable) {
      uVar9 = 1L << ((byte)lVar10 & 0x3f);
      break;
    }
  }
LAB_0017eee8:
  return uVar9 | uVar7;
}

Assistant:

SQLITE_PRIVATE Bitmask sqlite3WhereExprUsageNN(WhereMaskSet *pMaskSet, Expr *p){
  Bitmask mask;
  if( p->op==TK_COLUMN && !ExprHasProperty(p, EP_FixedCol) ){
    return sqlite3WhereGetMask(pMaskSet, p->iTable);
  }else if( ExprHasProperty(p, EP_TokenOnly|EP_Leaf) ){
    assert( p->op!=TK_IF_NULL_ROW );
    return 0;
  }
  mask = (p->op==TK_IF_NULL_ROW) ? sqlite3WhereGetMask(pMaskSet, p->iTable) : 0;
  if( p->pLeft ) mask |= sqlite3WhereExprUsageNN(pMaskSet, p->pLeft);
  if( p->pRight ){
    mask |= sqlite3WhereExprUsageNN(pMaskSet, p->pRight);
    assert( p->x.pList==0 );
  }else if( ExprHasProperty(p, EP_xIsSelect) ){
    if( ExprHasProperty(p, EP_VarSelect) ) pMaskSet->bVarSelect = 1;
    mask |= exprSelectUsage(pMaskSet, p->x.pSelect);
  }else if( p->x.pList ){
    mask |= sqlite3WhereExprListUsage(pMaskSet, p->x.pList);
  }
  return mask;
}